

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_transfers_db(feed_db_t *db,transfer_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  transfer_t *ptVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  transfer_t record;
  char qr [84];
  sqlite3_stmt *local_120;
  uint local_114;
  transfer_t local_110;
  char local_88 [80];
  undefined4 local_38;
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"transfers");
  if (0 < (int)uVar2) {
    pcVar7 = "SELECT from_stop_id, to_stop_id, transfer_type, min_transfer_time FROM `transfers`;";
    pcVar8 = local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + (ulong)bVar9 * -0x10 + 8;
    }
    local_38 = 0x3b6073;
    sqlite3_prepare_v2(db->conn,local_88,-1,&local_120,(char **)0x0);
    ptVar4 = (transfer_t *)malloc((ulong)uVar2 * 0x88);
    *records = ptVar4;
    uVar1 = 0xffffffff;
    if (ptVar4 != (transfer_t *)0x0) {
      lVar6 = 0;
      local_114 = uVar2;
      do {
        iVar3 = sqlite3_step(local_120);
        db->rc = iVar3;
        uVar1 = local_114;
        if (iVar3 != 100) break;
        init_transfer(&local_110);
        puVar5 = sqlite3_column_text(local_120,0);
        strcpy(local_110.from_stop_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_120,1);
        strcpy(local_110.to_stop_id,(char *)puVar5);
        local_110.transfer_type = sqlite3_column_int(local_120,2);
        local_110.min_transfer_time = sqlite3_column_int(local_120,3);
        memcpy((*records)->from_stop_id + lVar6,&local_110,0x88);
        lVar6 = lVar6 + 0x88;
        uVar1 = local_114;
      } while ((ulong)uVar2 * 0x88 != lVar6);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_120);
  }
  return uVar2;
}

Assistant:

int fetch_all_transfers_db(feed_db_t *db, transfer_t **records) {

    transfer_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "transfers");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "from_stop_id, to_stop_id, transfer_type, min_transfer_time "
                "FROM `transfers`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_transfer(&record);

        strcpy(record.from_stop_id, sqlite3_column_text(stmt, 0));
        strcpy(record.to_stop_id, sqlite3_column_text(stmt, 1));
        record.transfer_type = (transfer_type_t)sqlite3_column_int(stmt, 2);
        record.min_transfer_time = sqlite3_column_int(stmt, 3);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}